

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void selectPopWith(Walker *pWalker,Select *p)

{
  With *pWVar1;
  Select *pSVar2;
  
  if ((pWalker->pParse->pWith != (With *)0x0) && (p->pPrior == (Select *)0x0)) {
    do {
      pSVar2 = p;
      p = pSVar2->pNext;
    } while (p != (Select *)0x0);
    pWVar1 = pSVar2->pWith;
    if (pWVar1 != (With *)0x0) {
      pWalker->pParse->pWith = pWVar1->pOuter;
      return;
    }
  }
  return;
}

Assistant:

static void selectPopWith(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  if( OK_IF_ALWAYS_TRUE(pParse->pWith) && p->pPrior==0 ){
    With *pWith = findRightmost(p)->pWith;
    if( pWith!=0 ){
      assert( pParse->pWith==pWith );
      pParse->pWith = pWith->pOuter;
    }
  }
}